

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O1

QString * __thiscall QFileInfo::group(QString *__return_storage_ptr__,QFileInfo *this)

{
  QFileInfoPrivate *this_00;
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  storage_type *in_RCX;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d.ptr;
  if ((this_00->field_0x1db & 0x40) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_0023c018:
      __stack_chk_fail();
    }
    QFileInfoPrivate::getFileOwner(__return_storage_ptr__,this_00,OwnerGroup);
  }
  else {
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)"";
    QString::fromLatin1(&local_38,(QString *)0x0,ba);
    qVar3 = local_38.d.size;
    pcVar2 = local_38.d.ptr;
    pDVar1 = local_38.d.d;
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = pcVar2;
    local_38.d.size = 0;
    (__return_storage_ptr__->d).size = qVar3;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_0023c018;
  }
  return __return_storage_ptr__;
}

Assistant:

QString QFileInfo::group() const
{
    Q_D(const QFileInfo);
    if (d->isDefaultConstructed)
        return ""_L1;
    return d->getFileOwner(QAbstractFileEngine::OwnerGroup);
}